

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall cmMakefile::FindTargetToUse(cmMakefile *this,string *name,bool excludeAliases)

{
  const_iterator cVar1;
  cmTarget *pcVar2;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->ImportedTargets)._M_h,name);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar2 = FindTarget(this,name,excludeAliases);
    if (pcVar2 == (cmTarget *)0x0) {
      pcVar2 = cmGlobalGenerator::FindTarget
                         (this->LocalGenerator->GlobalGenerator,name,excludeAliases);
      return pcVar2;
    }
  }
  else {
    pcVar2 = *(cmTarget **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                     ._M_cur + 0x28);
  }
  return pcVar2;
}

Assistant:

cmTarget* cmMakefile::FindTargetToUse(const std::string& name,
                                      bool excludeAliases) const
{
  // Look for an imported target.  These take priority because they
  // are more local in scope and do not have to be globally unique.
  TargetMap::const_iterator
    imported = this->ImportedTargets.find(name);
  if(imported != this->ImportedTargets.end())
    {
    return imported->second;
    }

  // Look for a target built in this directory.
  if(cmTarget* t = this->FindTarget(name, excludeAliases))
    {
    return t;
    }

  // Look for a target built in this project.
  return this->GetGlobalGenerator()->FindTarget(name, excludeAliases);
}